

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_search_fwdflat.c
# Opt level: O0

void ngram_fwdflat_allocate_1ph(ngram_search_t *ngs)

{
  int iVar1;
  dict_t *pdVar2;
  int32 *piVar3;
  root_chan_t *prVar4;
  int local_24;
  int local_20;
  int w;
  int i;
  int n_words;
  dict_t *dict;
  ngram_search_t *ngs_local;
  
  pdVar2 = (ngs->base).dict;
  iVar1 = (ngs->base).n_words;
  ngs->n_1ph_words = 0;
  for (local_24 = 0; local_24 < iVar1; local_24 = local_24 + 1) {
    if (pdVar2->word[local_24].pronlen == 1) {
      ngs->n_1ph_words = ngs->n_1ph_words + 1;
    }
  }
  piVar3 = (int32 *)__ckd_calloc__((long)ngs->n_1ph_words,4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdflat.c"
                                   ,0x66);
  ngs->single_phone_wid = piVar3;
  prVar4 = (root_chan_t *)
           __ckd_calloc__((long)ngs->n_1ph_words,0x70,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdflat.c"
                          ,0x67);
  ngs->rhmm_1ph = prVar4;
  local_20 = 0;
  for (local_24 = 0; local_24 < iVar1; local_24 = local_24 + 1) {
    if (pdVar2->word[local_24].pronlen == 1) {
      ngs->rhmm_1ph[local_20].ciphone = *pdVar2->word[local_24].ciphone;
      ngs->rhmm_1ph[local_20].ci2phone = (int16)((ngs->base).acmod)->mdef->sil;
      hmm_init(ngs->hmmctx,&ngs->rhmm_1ph[local_20].hmm,1,
               ((ngs->base).acmod)->mdef->phone[ngs->rhmm_1ph[local_20].ciphone].ssid,
               ((ngs->base).acmod)->mdef->phone[ngs->rhmm_1ph[local_20].ciphone].tmat);
      ngs->rhmm_1ph[local_20].next = (chan_t *)0x0;
      ngs->word_chan[local_24] = (chan_t *)(ngs->rhmm_1ph + local_20);
      ngs->single_phone_wid[local_20] = local_24;
      local_20 = local_20 + 1;
    }
  }
  return;
}

Assistant:

static void
ngram_fwdflat_allocate_1ph(ngram_search_t *ngs)
{
    dict_t *dict = ps_search_dict(ngs);
    int n_words = ps_search_n_words(ngs);
    int i, w;

    /* Allocate single-phone words, since they won't have
     * been allocated for us by fwdtree initialization. */
    ngs->n_1ph_words = 0;
    for (w = 0; w < n_words; w++) {
        if (dict_is_single_phone(dict, w))
            ++ngs->n_1ph_words;
    }
    ngs->single_phone_wid = ckd_calloc(ngs->n_1ph_words,
                                       sizeof(*ngs->single_phone_wid));
    ngs->rhmm_1ph = ckd_calloc(ngs->n_1ph_words, sizeof(*ngs->rhmm_1ph));
    i = 0;
    for (w = 0; w < n_words; w++) {
        if (!dict_is_single_phone(dict, w))
            continue;

        /* DICT2PID location */
        ngs->rhmm_1ph[i].ciphone = dict_first_phone(dict, w);
        ngs->rhmm_1ph[i].ci2phone = bin_mdef_silphone(ps_search_acmod(ngs)->mdef);
        hmm_init(ngs->hmmctx, &ngs->rhmm_1ph[i].hmm, TRUE,
                 /* ssid */ bin_mdef_pid2ssid(ps_search_acmod(ngs)->mdef,
                                              ngs->rhmm_1ph[i].ciphone),
                 /* tmatid */ bin_mdef_pid2tmatid(ps_search_acmod(ngs)->mdef,
    						  ngs->rhmm_1ph[i].ciphone));
        ngs->rhmm_1ph[i].next = NULL;
        ngs->word_chan[w] = (chan_t *) &(ngs->rhmm_1ph[i]);
        ngs->single_phone_wid[i] = w;
        i++;
    }
}